

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Array2D<double> * __thiscall
pbrt::SummedAreaTable::integrate(SummedAreaTable *this,Array2D<float> *values,Allocator alloc)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  Array2D<float> *in_RDX;
  Array2D<double> *in_RDI;
  float fVar4;
  double dVar5;
  int x_1;
  int y_1;
  int y;
  int x;
  anon_class_8_1_70098e60 f;
  Array2D<double> *result;
  double in_stack_fffffffffffffed8;
  Array2D<double> *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffef0;
  Array2D<double> *in_stack_fffffffffffffef8;
  allocator_type in_stack_ffffffffffffff00;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  
  Array2D<float>::xSize(in_RDX);
  Array2D<float>::ySize(in_RDX);
  Array2D<double>::Array2D
            (in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
             (int)in_stack_fffffffffffffef0,in_stack_ffffffffffffff00);
  fVar4 = integrate::anon_class_8_1_70098e60::operator()
                    ((anon_class_8_1_70098e60 *)in_stack_fffffffffffffee0,
                     (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                     SUB84(in_stack_fffffffffffffed8,0));
  pdVar3 = Array2D<double>::operator()
                     (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                      SUB84(in_stack_fffffffffffffed8,0));
  *pdVar3 = (double)fVar4;
  for (local_48 = 1; iVar2 = Array2D<double>::xSize(in_RDI), local_48 < iVar2;
      local_48 = local_48 + 1) {
    fVar4 = integrate::anon_class_8_1_70098e60::operator()
                      ((anon_class_8_1_70098e60 *)in_stack_fffffffffffffee0,
                       (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                       SUB84(in_stack_fffffffffffffed8,0));
    pdVar3 = Array2D<double>::operator()
                       (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                        SUB84(in_stack_fffffffffffffed8,0));
    dVar1 = *pdVar3;
    pdVar3 = Array2D<double>::operator()
                       (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                        SUB84(in_stack_fffffffffffffed8,0));
    *pdVar3 = (double)fVar4 + dVar1;
  }
  for (local_4c = 1; iVar2 = Array2D<double>::ySize(in_RDI), local_4c < iVar2;
      local_4c = local_4c + 1) {
    fVar4 = integrate::anon_class_8_1_70098e60::operator()
                      ((anon_class_8_1_70098e60 *)in_stack_fffffffffffffee0,
                       (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                       SUB84(in_stack_fffffffffffffed8,0));
    pdVar3 = Array2D<double>::operator()
                       (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                        SUB84(in_stack_fffffffffffffed8,0));
    dVar1 = *pdVar3;
    pdVar3 = Array2D<double>::operator()
                       (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                        SUB84(in_stack_fffffffffffffed8,0));
    *pdVar3 = (double)fVar4 + dVar1;
  }
  for (local_50 = 1; iVar2 = Array2D<double>::ySize(in_RDI), local_50 < iVar2;
      local_50 = local_50 + 1) {
    for (local_54 = 1; iVar2 = Array2D<double>::xSize(in_RDI), local_54 < iVar2;
        local_54 = local_54 + 1) {
      fVar4 = integrate::anon_class_8_1_70098e60::operator()
                        ((anon_class_8_1_70098e60 *)in_stack_fffffffffffffee0,
                         (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                         SUB84(in_stack_fffffffffffffed8,0));
      dVar5 = (double)fVar4;
      pdVar3 = Array2D<double>::operator()
                         (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                          SUB84(in_stack_fffffffffffffed8,0));
      dVar1 = *pdVar3;
      pdVar3 = Array2D<double>::operator()
                         (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                          SUB84(in_stack_fffffffffffffed8,0));
      in_stack_fffffffffffffed8 = dVar5 + dVar1 + *pdVar3;
      in_stack_fffffffffffffee0 =
           (Array2D<double> *)
           Array2D<double>::operator()
                     (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                      SUB84(in_stack_fffffffffffffed8,0));
      dVar1 = in_stack_fffffffffffffed8 -
              (double)(in_stack_fffffffffffffee0->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
      pdVar3 = Array2D<double>::operator()
                         (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                          SUB84(in_stack_fffffffffffffed8,0));
      *pdVar3 = dVar1;
    }
  }
  return in_RDI;
}

Assistant:

Array2D<double> integrate(const Array2D<Float> &values, Allocator alloc) {
        auto f = [&values](int x, int y) {
            return values(x, y) / (values.xSize() * values.ySize());
        };
        Array2D<double> result(values.xSize(), values.ySize(), alloc);
        result(0, 0) = f(0, 0);
        // Compute sums along first scanline and column
        for (int x = 1; x < result.xSize(); ++x)
            result(x, 0) = f(x, 0) + result(x - 1, 0);
        for (int y = 1; y < result.ySize(); ++y)
            result(0, y) = f(0, y) + result(0, y - 1);

        // Compute sums for the remainder of the entries
        for (int y = 1; y < result.ySize(); ++y)
            for (int x = 1; x < result.xSize(); ++x)
                result(x, y) = (f(x, y) + result(x - 1, y) + result(x, y - 1) -
                                result(x - 1, y - 1));

        return result;
    }